

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall
sf::priv::WindowImplX11::setIcon(WindowImplX11 *this,uint width,uint height,Uint8 *pixels)

{
  byte bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  byte *pbVar4;
  reference pvVar5;
  reference pvVar6;
  Atom AVar7;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  Atom netWmIcon;
  size_t i_2;
  unsigned_long *ptr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> icccmIconPixels;
  XWMHints *hints;
  Uint8 opacity;
  size_t k;
  size_t i_1;
  size_t j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> maskPixels;
  size_t pitch;
  GC iconGC;
  XGCValues values;
  XImage *iconImage;
  uint defDepth;
  Visual *defVisual;
  size_t i;
  Uint8 *iconPixels;
  undefined8 in_stack_fffffffffffffdc8;
  ulong uVar8;
  uint uVar9;
  undefined4 in_stack_fffffffffffffddc;
  uint uVar10;
  undefined4 in_stack_fffffffffffffde4;
  size_type in_stack_fffffffffffffde8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdf0;
  undefined8 uVar11;
  undefined8 in_stack_fffffffffffffe00;
  undefined1 onlyIfExists;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar12;
  allocator local_189;
  string local_188 [32];
  Atom local_168;
  ulong local_160;
  reference local_158;
  undefined8 local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  undefined8 *local_128;
  undefined1 local_119;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  undefined1 local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ulong local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [128];
  long local_40;
  undefined4 local_34;
  undefined8 local_30;
  ulong local_28;
  void *local_20;
  long local_18;
  uint local_10;
  uint local_c;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_20 = malloc((ulong)(in_ESI * in_EDX * 4));
  for (local_28 = 0; local_28 < local_c * local_10; local_28 = local_28 + 1) {
    *(undefined1 *)((long)local_20 + local_28 * 4) = *(undefined1 *)(local_18 + 2 + local_28 * 4);
    *(undefined1 *)((long)local_20 + local_28 * 4 + 1) =
         *(undefined1 *)(local_18 + 1 + local_28 * 4);
    *(undefined1 *)((long)local_20 + local_28 * 4 + 2) = *(undefined1 *)(local_18 + local_28 * 4);
    *(undefined1 *)((long)local_20 + local_28 * 4 + 3) =
         *(undefined1 *)(local_18 + 3 + local_28 * 4);
  }
  local_30 = *(undefined8 *)
              (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) + (long)*(int *)(in_RDI + 0x3d8) * 0x80 +
              0x40);
  local_34 = *(undefined4 *)
              (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) + (long)*(int *)(in_RDI + 0x3d8) * 0x80 +
              0x38);
  uVar8 = CONCAT44(uVar12,local_c);
  local_40 = XCreateImage(*(undefined8 *)(in_RDI + 0x3d0),local_30,local_34,2,0,local_20,uVar8,
                          local_10,0x20,0);
  if (local_40 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to set the window\'s icon");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (*(long *)(in_RDI + 0x428) != 0) {
      XFreePixmap(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x428));
    }
    if (*(long *)(in_RDI + 0x430) != 0) {
      XFreePixmap(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x430));
    }
    uVar3 = XCreatePixmap(*(long *)(in_RDI + 0x3d0),
                          *(undefined8 *)
                           (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) + 0x10 +
                           (long)*(int *)(in_RDI + 0x3d8) * 0x80),local_c,local_10,local_34);
    *(undefined8 *)(in_RDI + 0x428) = uVar3;
    local_c8 = XCreateGC(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x428),0,local_c0)
    ;
    uVar9 = local_c;
    uVar10 = local_10;
    XPutImage(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x428),local_c8,local_40,0,0,
              uVar8 & 0xffffffff00000000,0);
    XFreeGC(*(undefined8 *)(in_RDI + 0x3d0),local_c8);
    (**(code **)(local_40 + 0x60))();
    local_d0 = (ulong)(local_c + 7 >> 3);
    local_e9 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x24add3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (value_type_conflict4 *)CONCAT44(in_stack_fffffffffffffde4,uVar10),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffddc,uVar9));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x24ae07);
    for (local_108 = 0; onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38),
        local_108 < local_10; local_108 = local_108 + 1) {
      for (local_110 = 0; local_110 < local_d0; local_110 = local_110 + 1) {
        for (local_118 = 0; local_118 < 8; local_118 = local_118 + 1) {
          if (local_110 * 8 + local_118 < (ulong)local_c) {
            local_119 = *(char *)(local_18 + 3 +
                                 (local_110 * 8 + local_118 + local_108 * local_c) * 4) != '\0';
            bVar1 = local_119 << ((byte)local_118 & 0x1f);
            pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_e8,local_110 + local_108 * local_d0);
            *pbVar4 = *pbVar4 | bVar1;
          }
        }
      }
    }
    uVar3 = *(undefined8 *)(in_RDI + 0x3c8);
    uVar11 = *(undefined8 *)(in_RDI + 0x3d0);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_e8,0);
    uVar3 = XCreatePixmapFromBitmapData(uVar11,uVar3,pvVar5,local_c,local_10,1,0,1);
    *(undefined8 *)(in_RDI + 0x430) = uVar3;
    local_128 = (undefined8 *)XAllocWMHints();
    *local_128 = 0x24;
    local_128[2] = *(undefined8 *)(in_RDI + 0x428);
    local_128[5] = *(undefined8 *)(in_RDI + 0x430);
    XSetWMHints(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),local_128);
    XFree(local_128);
    local_148 = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x24b0ea);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffde4,uVar10),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffddc,uVar9));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x24b118);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_140,0);
    *pvVar6 = (ulong)local_c;
    pvVar6[1] = (ulong)local_10;
    local_158 = pvVar6 + 2;
    for (local_160 = 0; local_160 < local_c * local_10; local_160 = local_160 + 1) {
      *local_158 = (long)CONCAT13(*(undefined1 *)(local_18 + 3 + local_160 * 4),
                                  CONCAT12(*(undefined1 *)(local_18 + local_160 * 4),
                                           CONCAT11(*(undefined1 *)(local_18 + 1 + local_160 * 4),
                                                    *(undefined1 *)(local_18 + 2 + local_160 * 4))))
      ;
      local_158 = local_158 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"_NET_WM_ICON",&local_189);
    AVar7 = getAtom((string *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                    (bool)onlyIfExists);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    uVar3 = *(undefined8 *)(in_RDI + 0x3c8);
    uVar11 = *(undefined8 *)(in_RDI + 0x3d0);
    uVar12 = 0;
    local_168 = AVar7;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_140,0);
    XChangeProperty(uVar11,uVar3,AVar7,6,0x20,uVar12,pvVar6,local_c * local_10 + 2);
    XFlush(*(undefined8 *)(in_RDI + 0x3d0));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffde4,uVar10));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffde4,uVar10));
  }
  return;
}

Assistant:

void WindowImplX11::setIcon(unsigned int width, unsigned int height, const Uint8* pixels)
{
    // X11 wants BGRA pixels: swap red and blue channels
    // Note: this memory will be freed by XDestroyImage
    Uint8* iconPixels = static_cast<Uint8*>(std::malloc(width * height * 4));
    for (std::size_t i = 0; i < width * height; ++i)
    {
        iconPixels[i * 4 + 0] = pixels[i * 4 + 2];
        iconPixels[i * 4 + 1] = pixels[i * 4 + 1];
        iconPixels[i * 4 + 2] = pixels[i * 4 + 0];
        iconPixels[i * 4 + 3] = pixels[i * 4 + 3];
    }

    // Create the icon pixmap
    Visual*      defVisual = DefaultVisual(m_display, m_screen);
    unsigned int defDepth  = static_cast<unsigned int>(DefaultDepth(m_display, m_screen));
    XImage* iconImage = XCreateImage(m_display, defVisual, defDepth, ZPixmap, 0, reinterpret_cast<char*>(iconPixels), width, height, 32, 0);
    if (!iconImage)
    {
        err() << "Failed to set the window's icon" << std::endl;
        return;
    }

    if (m_iconPixmap)
        XFreePixmap(m_display, m_iconPixmap);

    if (m_iconMaskPixmap)
        XFreePixmap(m_display, m_iconMaskPixmap);

    m_iconPixmap = XCreatePixmap(m_display, RootWindow(m_display, m_screen), width, height, defDepth);
    XGCValues values;
    GC iconGC = XCreateGC(m_display, m_iconPixmap, 0, &values);
    XPutImage(m_display, m_iconPixmap, iconGC, iconImage, 0, 0, 0, 0, width, height);
    XFreeGC(m_display, iconGC);
    XDestroyImage(iconImage);

    // Create the mask pixmap (must have 1 bit depth)
    std::size_t pitch = (width + 7) / 8;
    std::vector<Uint8> maskPixels(pitch * height, 0);
    for (std::size_t j = 0; j < height; ++j)
    {
        for (std::size_t i = 0; i < pitch; ++i)
        {
            for (std::size_t k = 0; k < 8; ++k)
            {
                if (i * 8 + k < width)
                {
                    Uint8 opacity = (pixels[(i * 8 + k + j * width) * 4 + 3] > 0) ? 1 : 0;
                    maskPixels[i + j * pitch] |= static_cast<Uint8>(opacity << k);
                }
            }
        }
    }
    m_iconMaskPixmap = XCreatePixmapFromBitmapData(m_display, m_window, reinterpret_cast<char*>(&maskPixels[0]), width, height, 1, 0, 1);

    // Send our new icon to the window through the WMHints
    XWMHints* hints = XAllocWMHints();
    hints->flags       = IconPixmapHint | IconMaskHint;
    hints->icon_pixmap = m_iconPixmap;
    hints->icon_mask   = m_iconMaskPixmap;
    XSetWMHints(m_display, m_window, hints);
    XFree(hints);

    // ICCCM wants BGRA pixels: swap red and blue channels
    // ICCCM also wants the first 2 unsigned 32-bit values to be width and height
    std::vector<unsigned long> icccmIconPixels(2 + width * height, 0);
    unsigned long* ptr = &icccmIconPixels[0];

    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wnull-dereference" // False positive.
    *ptr++ = width;
    *ptr++ = height;
    #pragma GCC diagnostic pop

    for (std::size_t i = 0; i < width * height; ++i)
    {
        *ptr++ = static_cast<unsigned long>((pixels[i * 4 + 2] << 0 ) |
                                            (pixels[i * 4 + 1] << 8 ) |
                                            (pixels[i * 4 + 0] << 16) |
                                            (pixels[i * 4 + 3] << 24));
    }

    Atom netWmIcon = getAtom("_NET_WM_ICON");

    XChangeProperty(m_display,
                    m_window,
                    netWmIcon,
                    XA_CARDINAL,
                    32,
                    PropModeReplace,
                    reinterpret_cast<const unsigned char*>(&icccmIconPixels[0]),
                    static_cast<int>(2 + width * height));

    XFlush(m_display);
}